

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::SetCursorPosX(float x)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  fVar2 = ((pIVar1->Pos).x - (pIVar1->Scroll).x) + x;
  (pIVar1->DC).CursorPos.x = fVar2;
  auVar4 = ZEXT416((uint)(pIVar1->DC).CursorMaxPos.x);
  auVar3 = vcmpss_avx(ZEXT416((uint)fVar2),auVar4,2);
  auVar3 = vblendvps_avx(ZEXT416((uint)fVar2),auVar4,auVar3);
  (pIVar1->DC).CursorMaxPos.x = auVar3._0_4_;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }